

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

void ApprovalTests::SystemUtils::makeDirectoryForNonWindows(string *directory)

{
  char *__path;
  runtime_error *this;
  string helpMessage;
  int nError;
  mode_t nMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 local_51 [33];
  string local_30 [32];
  int local_10;
  __mode_t local_c;
  
  local_c = 0x1db;
  __path = (char *)::std::__cxx11::string::c_str();
  local_10 = mkdir(__path,local_c);
  if (local_10 != 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_51 + 1),"Unable to create directory: ",(allocator *)__rhs);
    ::std::operator+(in_stack_ffffffffffffff98,__rhs);
    ::std::__cxx11::string::~string((string *)(local_51 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_51);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,local_30);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SystemUtils::makeDirectoryForNonWindows(const std::string& directory)
    {
        APPROVAL_TESTS_UNUSED(directory);
#ifndef _WIN32
        mode_t nMode = 0733; // UNIX style permissions
        int nError = mkdir(directory.c_str(), nMode);
        if (nError != 0)
        {
            std::string helpMessage =
                std::string("Unable to create directory: ") + directory;
            throw std::runtime_error(helpMessage);
        }
#endif
    }